

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInfo.Common.cpp
# Opt level: O2

bool PlatformAgnostic::SystemInfo::GetBinaryLocation(char16 *path,uint size)

{
  bool bVar1;
  LPCUTF8 path_00;
  size_t sVar2;
  size_t sVar3;
  LPCUTF8 local_30;
  char *tmp;
  
  path_00 = (LPCUTF8)malloc((long)(int)(size * 3));
  local_30 = path_00;
  bVar1 = GetBinaryLocation((char *)path_00,size * 3);
  if (bVar1) {
    sVar2 = strlen((char *)path_00);
    sVar3 = utf8::DecodeUnitsIntoAndNullTerminate
                      (path,&local_30,path_00 + sVar2,doDefault,(bool *)0x0);
    free(local_30);
    if (sVar3 != 0) {
      return true;
    }
    wcscpy_s(path,(ulong)size,L"GetBinaryLocation: DecodeUnitsIntoAndNullTerminate has failed.");
  }
  else {
    free(path_00);
  }
  return false;
}

Assistant:

bool SystemInfo::GetBinaryLocation(char16 *path, const unsigned size)
    {
        int tmp_size = size * 3;
        char *tmp = (char*)malloc(tmp_size);
        if (!GetBinaryLocation(tmp, tmp_size))
        {
            free(tmp);
            return false;
        }
        if (utf8::DecodeUnitsIntoAndNullTerminate(path, (LPCUTF8&)tmp, (LPCUTF8)tmp + strlen(tmp)) <= 0)
        {
            free(tmp);
            wcscpy_s(path, size, _u("GetBinaryLocation: DecodeUnitsIntoAndNullTerminate has failed."));
            return false;
        }
        free(tmp);
        return true;
    }